

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  undefined4 *puVar1;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *this_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg_01;
  uint arg_id;
  ulong uVar2;
  type tVar3;
  internal iVar4;
  long *plVar5;
  internal *piVar6;
  error_handler *vis;
  internal *piVar7;
  internal *piVar8;
  basic_string_view<char> name;
  null_terminating_iterator<char> nVar9;
  undefined1 local_51;
  undefined1 *local_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  plVar5 = (long *)it.end_;
  piVar6 = (internal *)it.ptr_;
  if (this == piVar6) {
    iVar4 = (internal)0x0;
LAB_0011fe39:
    if ((iVar4 != (internal)0x5f) && (0x19 < (byte)(((byte)iVar4 & 0xdf) + 0xbf))) {
LAB_0011feef:
      error_handler::on_error((error_handler *)this,"invalid format string");
    }
    name.size_ = 0;
    piVar7 = this + 1;
    do {
      piVar8 = piVar7;
      if (piVar8 == piVar6) {
        iVar4 = (internal)0x0;
      }
      else {
        iVar4 = *piVar8;
      }
      piVar7 = piVar8 + 1;
      name.size_ = name.size_ + 1;
    } while ((((byte)((char)iVar4 - 0x30U) < 10) || (iVar4 == (internal)0x5f)) ||
            ((byte)(((byte)iVar4 & 0xdf) + 0xbf) < 0x1a));
    puVar1 = *(undefined4 **)*plVar5;
    name.data_ = (char *)this;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    get_arg((format_arg *)&local_48.string,
            (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
             *)((undefined8 *)*plVar5)[1],name);
    local_50 = &local_51;
    this = (internal *)&local_50;
    arg_01.value_.field_0.string.size = local_48.string.size;
    arg_01.value_.field_0.long_long_value = local_48.long_long_value;
    arg_01._16_8_ = local_38;
    arg_01._24_8_ = uStack_30;
    tVar3 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                      ((width_checker<fmt::v5::internal::error_handler> *)this,arg_01);
    if ((tVar3 & 0xffffffff80000000) != 0) goto LAB_0011fee3;
    *puVar1 = (int)tVar3;
  }
  else {
    iVar4 = *this;
    if ((iVar4 == (internal)0x7d) || (iVar4 == (internal)0x3a)) {
      puVar1 = *(undefined4 **)*plVar5;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::next_arg((format_arg *)&local_48.string,
                 (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                  *)((undefined8 *)*plVar5)[1]);
      local_50 = &local_51;
      vis = (error_handler *)&local_50;
      arg.value_.field_0.string.size = local_48.string.size;
      arg.value_.field_0.long_long_value = local_48.long_long_value;
      arg._16_8_ = local_38;
      arg._24_8_ = uStack_30;
      uVar2 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        ((width_checker<fmt::v5::internal::error_handler> *)vis,arg);
      piVar8 = this;
      this = (internal *)vis;
    }
    else {
      if (9 < (byte)((char)iVar4 - 0x30U)) goto LAB_0011fe39;
      arg_id = 0;
      piVar7 = this + 1;
      do {
        piVar8 = piVar7;
        if (0xccccccc < arg_id) goto LAB_0011fee3;
        arg_id = ((uint)(byte)iVar4 + arg_id * 10) - 0x30;
        if (piVar8 == piVar6) {
          if ((int)arg_id < 0) goto LAB_0011fee3;
          goto LAB_0011feef;
        }
        iVar4 = *piVar8;
        piVar7 = piVar8 + 1;
      } while ((byte)((char)iVar4 - 0x30U) < 10);
      if ((int)arg_id < 0) goto LAB_0011fee3;
      if ((iVar4 != (internal)0x3a) && (iVar4 != (internal)0x7d)) goto LAB_0011feef;
      this_00 = (context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 *)((undefined8 *)*plVar5)[1];
      if (0 < (this_00->parse_context_).next_arg_id_) {
        error_handler::on_error
                  ((error_handler *)this,"cannot switch from automatic to manual argument indexing")
        ;
      }
      puVar1 = *(undefined4 **)*plVar5;
      (this_00->parse_context_).next_arg_id_ = -1;
      context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      ::do_get_arg((format_arg *)&local_48.string,this_00,arg_id);
      local_50 = &local_51;
      this = (internal *)&local_50;
      arg_00.value_.field_0.string.size = local_48.string.size;
      arg_00.value_.field_0.long_long_value = local_48.long_long_value;
      arg_00._16_8_ = local_38;
      arg_00._24_8_ = uStack_30;
      uVar2 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        ((width_checker<fmt::v5::internal::error_handler> *)this,arg_00);
    }
    if ((uVar2 & 0xffffffff80000000) != 0) {
LAB_0011fee3:
      error_handler::on_error((error_handler *)this,"number is too big");
    }
    *puVar1 = (int)uVar2;
  }
  nVar9.end_ = (char *)piVar6;
  nVar9.ptr_ = (char *)piVar8;
  return nVar9;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}